

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::FastF64S2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  unsigned_long uVar1;
  uint uVar2;
  unsigned_long *puVar3;
  ulong uVar4;
  char *pcVar5;
  uint *puVar6;
  ulong uVar7;
  ushort *puVar8;
  
  if (data.field_0._0_2_ != 0) {
    pcVar5 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar5;
  }
  uVar7 = hasbits | 1L << ((ulong)data.field_0 >> 0x10 & 0x3f);
  uVar1 = *(unsigned_long *)(ptr + 2);
  puVar3 = RefAt<unsigned_long>(msg,(ulong)data.field_0 >> 0x30);
  *puVar3 = uVar1;
  puVar8 = (ushort *)(ptr + 10);
  if (puVar8 < (ctx->super_EpsCopyInputStream).limit_end_) {
    uVar2 = (uint)table->fast_idx_mask & (uint)*puVar8;
    if ((uVar2 & 7) == 0) {
      uVar4 = (ulong)(uVar2 & 0xfffffff8);
      pcVar5 = (char *)(**(code **)(&table[1].has_bits_offset + uVar4))
                                 (msg,puVar8,ctx,
                                  (ulong)*puVar8 ^ *(ulong *)(&table[1].fast_idx_mask + uVar4 * 2),
                                  table,uVar7);
      return pcVar5;
    }
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x452);
  }
  if ((ulong)table->has_bits_offset != 0) {
    puVar6 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
    *puVar6 = *puVar6 | (uint)uVar7;
  }
  return (char *)puVar8;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastF64S2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularFixed<uint64_t, uint16_t>(
      PROTOBUF_TC_PARAM_PASS);
}